

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O1

string * __thiscall
pstack::Dwarf::DWARFReader::readFormString_abi_cxx11_
          (string *__return_storage_ptr__,DWARFReader *this,Info *dwarf,Unit *unit,Form form)

{
  ostream *this_00;
  element_type *peVar1;
  int iVar2;
  uintmax_t uVar3;
  undefined4 extraout_var;
  Exception *this_01;
  long extraout_RDX;
  string *s;
  undefined1 local_1d0 [416];
  
  if ((int)form < 0x1a) {
    if (form == DW_FORM_string) {
      peVar1 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_Reader[7])(__return_storage_ptr__,peVar1,this->off);
      this->off = __return_storage_ptr__->_M_string_length + this->off + 1;
      return __return_storage_ptr__;
    }
    if (form != DW_FORM_strp) {
LAB_00143b8b:
      this_01 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset((Exception *)local_1d0,0,0x1a0);
      Exception::Exception((Exception *)local_1d0);
      this_00 = (ostream *)(local_1d0 + 8);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"unhandled form ",0xf);
      std::ostream::operator<<(this_00,form);
      std::__ostream_insert<char,std::char_traits<char>>(this_00," when reading string",0x14);
      Exception::Exception(this_01,(Exception *)local_1d0);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
    uVar3 = getuint(this,unit->dwarfLen);
    Elf::Section::io((Section *)local_1d0);
    (*(*(_func_int ***)local_1d0._0_8_)[7])(__return_storage_ptr__,local_1d0._0_8_,uVar3);
  }
  else {
    if (form == DW_FORM_strx) {
      peVar1 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar2 = (*peVar1->_vptr_Reader[3])(peVar1,this->off);
      this->off = this->off + extraout_RDX;
      Unit::strx_abi_cxx11_(__return_storage_ptr__,unit,CONCAT44(extraout_var,iVar2));
      return __return_storage_ptr__;
    }
    if (form != DW_FORM_line_strp) goto LAB_00143b8b;
    uVar3 = getuint(this,unit->dwarfLen);
    Elf::Section::io((Section *)local_1d0);
    (*(*(_func_int ***)local_1d0._0_8_)[7])(__return_storage_ptr__,local_1d0._0_8_,uVar3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
DWARFReader::readFormString(const Info &dwarf, Unit &unit, Form form)
{
    switch (form) {
        case DW_FORM_string:
            return getstring();
        case DW_FORM_line_strp: {
            auto off = getuint(unit.dwarfLen);
            return dwarf.debugLineStrings.io()->readString(off);
        }
        case DW_FORM_strp: {
            auto off = getuint(unit.dwarfLen);
            return dwarf.debugStrings.io()->readString(off);
        }
        case DW_FORM_strx: {
            size_t off = getuleb128();
            return unit.strx(off);
        }
        default: {
            throw (Exception() << "unhandled form " << form << " when reading string");
        }
    }
}